

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O2

void __thiscall
cmOSXBundleGenerator::CreateFramework
          (cmOSXBundleGenerator *this,string *targetName,string *outpath,string *config,
          SkipParts *skipParts)

{
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Var1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar2;
  string *filename;
  SkipParts *pSVar3;
  bool bVar4;
  iterator iVar5;
  string plist;
  string newName;
  string oldName;
  undefined1 local_130 [48];
  string contentdir;
  string local_e0;
  string *local_c0;
  SkipParts *local_b8;
  string name;
  string newoutpath;
  string versions;
  string frameworkVersion;
  
  bVar4 = MustSkip(this);
  if (!bVar4) {
    local_c0 = targetName;
    local_b8 = skipParts;
    if (this->MacContentFolders ==
        (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      __assert_fail("this->MacContentFolders",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmOSXBundleGenerator.cxx"
                    ,0x42,
                    "void cmOSXBundleGenerator::CreateFramework(const std::string &, const std::string &, const std::string &, const cmOSXBundleGenerator::SkipParts &)"
                   );
    }
    plist._M_string_length = (size_type)(outpath->_M_dataplus)._M_p;
    plist._M_dataplus._M_p = (pointer)outpath->_M_string_length;
    local_130._8_8_ = local_130 + 0x10;
    local_130._0_8_ = (pointer)0x1;
    local_130[0x10] = '/';
    cmGeneratorTarget::GetFrameworkDirectory(&newoutpath,this->GT,config,ContentLevel);
    frameworkVersion._M_dataplus._M_p._0_1_ = 0x2f;
    cmStrCat<std::__cxx11::string,char>
              (&contentdir,(cmAlphaNum *)&plist,(cmAlphaNum *)local_130,&newoutpath,
               (char *)&frameworkVersion);
    std::__cxx11::string::~string((string *)&newoutpath);
    std::operator+(&plist,outpath,"/");
    cmGeneratorTarget::GetFrameworkDirectory((string *)local_130,this->GT,config,FullLevel);
    std::operator+(&newoutpath,&plist,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
    pSVar3 = local_b8;
    filename = local_c0;
    std::__cxx11::string::~string((string *)local_130);
    std::__cxx11::string::~string((string *)&plist);
    cmGeneratorTarget::GetFrameworkVersion_abi_cxx11_(&frameworkVersion,this->GT);
    cmsys::SystemTools::GetFilenameName(&name,filename);
    if (pSVar3->infoPlist == false) {
      std::__cxx11::string::string((string *)&plist,(string *)&newoutpath);
      bVar4 = cmMakefile::PlatformIsAppleEmbedded(this->Makefile);
      if (!bVar4) {
        this_00 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   *)this->MacContentFolders;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_130,"Resources",(allocator<char> *)&oldName);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_130);
        std::__cxx11::string::~string((string *)local_130);
        std::__cxx11::string::append((char *)&plist);
      }
      std::__cxx11::string::append((char *)&plist);
      cmLocalGenerator::GenerateFrameworkInfoPList(this->LocalGenerator,this->GT,&name,&plist);
      std::__cxx11::string::~string((string *)&plist);
    }
    bVar4 = cmMakefile::PlatformIsAppleEmbedded(this->Makefile);
    if (!bVar4) {
      oldName._M_dataplus._M_p = (pointer)&oldName.field_2;
      oldName._M_string_length = 0;
      newName._M_dataplus._M_p = (pointer)&newName.field_2;
      newName._M_string_length = 0;
      oldName.field_2._M_local_buf[0] = '\0';
      newName.field_2._M_local_buf[0] = '\0';
      plist._M_dataplus._M_p = (pointer)contentdir._M_string_length;
      plist._M_string_length = (size_type)contentdir._M_dataplus._M_p;
      local_130._0_8_ = (pointer)0x8;
      local_130._8_8_ = "Versions";
      cmStrCat<>(&versions,(cmAlphaNum *)&plist,(cmAlphaNum *)local_130);
      cmsys::SystemTools::MakeDirectory(&versions,(mode_t *)0x0);
      cmsys::SystemTools::MakeDirectory(&newoutpath,(mode_t *)0x0);
      std::__cxx11::string::_M_assign((string *)&oldName);
      plist._M_dataplus._M_p = (pointer)versions._M_string_length;
      plist._M_string_length = (size_type)versions._M_dataplus._M_p;
      local_130._0_8_ = (pointer)0x8;
      local_130._8_8_ = "/Current";
      cmStrCat<>(&local_e0,(cmAlphaNum *)&plist,(cmAlphaNum *)local_130);
      std::__cxx11::string::operator=((string *)&newName,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      cmsys::SystemTools::RemoveFile(&newName);
      cmSystemTools::CreateSymlink(&oldName,&newName);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->Makefile->OutputFiles,&newName);
      plist._M_dataplus._M_p = &DAT_00000011;
      plist._M_string_length = (size_type)anon_var_dwarf_123b0e2;
      local_130._0_8_ = name._M_string_length;
      local_130._8_8_ = name._M_dataplus._M_p;
      cmStrCat<>(&local_e0,(cmAlphaNum *)&plist,(cmAlphaNum *)local_130);
      std::__cxx11::string::operator=((string *)&oldName,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      plist._M_dataplus._M_p = (pointer)contentdir._M_string_length;
      plist._M_string_length = (size_type)contentdir._M_dataplus._M_p;
      local_130._0_8_ = name._M_string_length;
      local_130._8_8_ = name._M_dataplus._M_p;
      cmStrCat<>(&local_e0,(cmAlphaNum *)&plist,(cmAlphaNum *)local_130);
      std::__cxx11::string::operator=((string *)&newName,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      cmsys::SystemTools::RemoveFile(&newName);
      cmSystemTools::CreateSymlink(&oldName,&newName);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->Makefile->OutputFiles,&newName);
      p_Var1 = &this->MacContentFolders->_M_t;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&plist,"Resources",(allocator<char> *)local_130);
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(p_Var1,&plist);
      psVar2 = this->MacContentFolders;
      std::__cxx11::string::~string((string *)&plist);
      if ((_Rb_tree_header *)iVar5._M_node != &(psVar2->_M_t)._M_impl.super__Rb_tree_header) {
        std::__cxx11::string::assign((char *)&oldName);
        plist._M_dataplus._M_p = (pointer)contentdir._M_string_length;
        plist._M_string_length = (size_type)contentdir._M_dataplus._M_p;
        local_130._0_8_ = &DAT_00000009;
        local_130._8_8_ = "Resources";
        cmStrCat<>(&local_e0,(cmAlphaNum *)&plist,(cmAlphaNum *)local_130);
        std::__cxx11::string::operator=((string *)&newName,(string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        cmsys::SystemTools::RemoveFile(&newName);
        cmSystemTools::CreateSymlink(&oldName,&newName);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->Makefile->OutputFiles,&newName);
      }
      p_Var1 = &this->MacContentFolders->_M_t;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&plist,"Headers",(allocator<char> *)local_130);
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(p_Var1,&plist);
      psVar2 = this->MacContentFolders;
      std::__cxx11::string::~string((string *)&plist);
      if ((_Rb_tree_header *)iVar5._M_node != &(psVar2->_M_t)._M_impl.super__Rb_tree_header) {
        std::__cxx11::string::assign((char *)&oldName);
        plist._M_dataplus._M_p = (pointer)contentdir._M_string_length;
        plist._M_string_length = (size_type)contentdir._M_dataplus._M_p;
        local_130._0_8_ = (pointer)0x7;
        local_130._8_8_ = "Headers";
        cmStrCat<>(&local_e0,(cmAlphaNum *)&plist,(cmAlphaNum *)local_130);
        std::__cxx11::string::operator=((string *)&newName,(string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        cmsys::SystemTools::RemoveFile(&newName);
        cmSystemTools::CreateSymlink(&oldName,&newName);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->Makefile->OutputFiles,&newName);
      }
      p_Var1 = &this->MacContentFolders->_M_t;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&plist,"PrivateHeaders",(allocator<char> *)local_130);
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(p_Var1,&plist);
      psVar2 = this->MacContentFolders;
      std::__cxx11::string::~string((string *)&plist);
      if ((_Rb_tree_header *)iVar5._M_node != &(psVar2->_M_t)._M_impl.super__Rb_tree_header) {
        std::__cxx11::string::assign((char *)&oldName);
        plist._M_dataplus._M_p = (pointer)contentdir._M_string_length;
        plist._M_string_length = (size_type)contentdir._M_dataplus._M_p;
        local_130._0_8_ = (pointer)0xe;
        local_130._8_8_ = "PrivateHeaders";
        cmStrCat<>(&local_e0,(cmAlphaNum *)&plist,(cmAlphaNum *)local_130);
        std::__cxx11::string::operator=((string *)&newName,(string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        cmsys::SystemTools::RemoveFile(&newName);
        cmSystemTools::CreateSymlink(&oldName,&newName);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->Makefile->OutputFiles,&newName);
      }
      std::__cxx11::string::~string((string *)&versions);
      std::__cxx11::string::~string((string *)&newName);
      std::__cxx11::string::~string((string *)&oldName);
    }
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&frameworkVersion);
    std::__cxx11::string::~string((string *)&newoutpath);
    std::__cxx11::string::~string((string *)&contentdir);
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::CreateFramework(
  const std::string& targetName, const std::string& outpath,
  const std::string& config, const cmOSXBundleGenerator::SkipParts& skipParts)
{
  if (this->MustSkip()) {
    return;
  }

  assert(this->MacContentFolders);

  // Compute the location of the top-level foo.framework directory.
  std::string contentdir = cmStrCat(
    outpath, '/',
    this->GT->GetFrameworkDirectory(config, cmGeneratorTarget::ContentLevel),
    '/');

  std::string newoutpath = outpath + "/" +
    this->GT->GetFrameworkDirectory(config, cmGeneratorTarget::FullLevel);

  std::string frameworkVersion = this->GT->GetFrameworkVersion();

  std::string name = cmSystemTools::GetFilenameName(targetName);
  if (!skipParts.infoPlist) {
    // Configure the Info.plist file
    std::string plist = newoutpath;
    if (!this->Makefile->PlatformIsAppleEmbedded()) {
      // Put the Info.plist file into the Resources directory.
      this->MacContentFolders->insert("Resources");
      plist += "/Resources";
    }
    plist += "/Info.plist";
    this->LocalGenerator->GenerateFrameworkInfoPList(this->GT, name, plist);
  }

  // Generate Versions directory only for MacOSX frameworks
  if (this->Makefile->PlatformIsAppleEmbedded()) {
    return;
  }

  // TODO: Use the cmMakefileTargetGenerator::ExtraFiles vector to
  // drive rules to create these files at build time.
  std::string oldName;
  std::string newName;

  // Make foo.framework/Versions
  std::string versions = cmStrCat(contentdir, "Versions");
  cmSystemTools::MakeDirectory(versions);

  // Make foo.framework/Versions/version
  cmSystemTools::MakeDirectory(newoutpath);

  // Current -> version
  oldName = frameworkVersion;
  newName = cmStrCat(versions, "/Current");
  cmSystemTools::RemoveFile(newName);
  cmSystemTools::CreateSymlink(oldName, newName);
  this->Makefile->AddCMakeOutputFile(newName);

  // foo -> Versions/Current/foo
  oldName = cmStrCat("Versions/Current/", name);
  newName = cmStrCat(contentdir, name);
  cmSystemTools::RemoveFile(newName);
  cmSystemTools::CreateSymlink(oldName, newName);
  this->Makefile->AddCMakeOutputFile(newName);

  // Resources -> Versions/Current/Resources
  if (this->MacContentFolders->find("Resources") !=
      this->MacContentFolders->end()) {
    oldName = "Versions/Current/Resources";
    newName = cmStrCat(contentdir, "Resources");
    cmSystemTools::RemoveFile(newName);
    cmSystemTools::CreateSymlink(oldName, newName);
    this->Makefile->AddCMakeOutputFile(newName);
  }

  // Headers -> Versions/Current/Headers
  if (this->MacContentFolders->find("Headers") !=
      this->MacContentFolders->end()) {
    oldName = "Versions/Current/Headers";
    newName = cmStrCat(contentdir, "Headers");
    cmSystemTools::RemoveFile(newName);
    cmSystemTools::CreateSymlink(oldName, newName);
    this->Makefile->AddCMakeOutputFile(newName);
  }

  // PrivateHeaders -> Versions/Current/PrivateHeaders
  if (this->MacContentFolders->find("PrivateHeaders") !=
      this->MacContentFolders->end()) {
    oldName = "Versions/Current/PrivateHeaders";
    newName = cmStrCat(contentdir, "PrivateHeaders");
    cmSystemTools::RemoveFile(newName);
    cmSystemTools::CreateSymlink(oldName, newName);
    this->Makefile->AddCMakeOutputFile(newName);
  }
}